

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridge.cpp
# Opt level: O0

void __thiscall despot::Bridge::PrintAction(Bridge *this,ACT_TYPE action,ostream *out)

{
  ostream *poVar1;
  ostream *out_local;
  ACT_TYPE action_local;
  Bridge *this_local;
  
  if (action == LEFT) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Move left");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else if (action == RIGHT) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Move right");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout,"Call for help");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void Bridge::PrintAction(ACT_TYPE action, ostream& out) const {
	if (action == LEFT) {
		cout << "Move left" << endl;
	} else if (action == RIGHT) {
		cout << "Move right" << endl;
	} else {
		cout << "Call for help" << endl;
	}
}